

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O3

Variant * __thiscall diligent_spirv_cross::Variant::operator=(Variant *this,Variant *other)

{
  IVariant *pIVar1;
  
  if (this != other) {
    if (this->holder != (IVariant *)0x0) {
      (**(code **)(*(long *)this->group->pools[this->type]._M_t.
                            super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
                            .super__Head_base<0UL,_diligent_spirv_cross::ObjectPoolBase_*,_false> +
                  0x10))();
    }
    pIVar1 = other->holder;
    this->group = other->group;
    this->holder = pIVar1;
    this->type = other->type;
    this->allow_type_rewrite = other->allow_type_rewrite;
    other->holder = (IVariant *)0x0;
    other->type = TypeNone;
  }
  return this;
}

Assistant:

Variant &operator=(Variant &&other) SPIRV_CROSS_NOEXCEPT
	{
		if (this != &other)
		{
			if (holder)
				group->pools[type]->deallocate_opaque(holder);
			holder = other.holder;
			group = other.group;
			type = other.type;
			allow_type_rewrite = other.allow_type_rewrite;

			other.holder = nullptr;
			other.type = TypeNone;
		}
		return *this;
	}